

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::null_scoped_padder>::format
          (short_level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3
          ,memory_buf_t *dest)

{
  string_view_t view;
  size_t sVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  basic_string_view<char> *in_RDI;
  null_scoped_padder p;
  string_view_t level_name;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  memory_buf_t *local_28;
  
  level::to_short_c_str(*(level_enum *)(in_RSI + 0x10));
  ::fmt::v6::basic_string_view<char>::basic_string_view(in_RDI,in_stack_ffffffffffffffa8);
  sVar1 = ::fmt::v6::basic_string_view<char>::size
                    ((basic_string_view<char> *)&stack0xffffffffffffffd0);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffcf,sVar1,(padding_info *)&in_RDI->size_,
             in_RCX);
  view.size_ = (size_t)in_stack_ffffffffffffffd0;
  view.data_ = in_stack_ffffffffffffffc8;
  fmt_helper::append_string_view(view,local_28);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }